

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsender.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  SocketLog *pSVar2;
  int local_494;
  duration<long,_std::ratio<1L,_1L>_> local_490;
  allocator local_481;
  string local_480 [36];
  int local_45c;
  char local_458 [4];
  int count;
  char buf [1024];
  anon_class_1_0_00000001 local_39;
  Interceptor local_38;
  SocketLog *local_18;
  SocketLog *socketLog;
  
  socketLog._4_4_ = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Send string every 1s...");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  pSVar2 = SocketLog::getInstance();
  local_18 = pSVar2;
  std::function<bool(std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_38,&local_39);
  SocketLog::setSendInterceptor(pSVar2,&local_38);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  local_45c = 0;
  do {
    local_45c = local_45c + 1;
    sprintf(local_458,"hello, count=%d\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"try to send:");
    std::operator<<(poVar1,local_458);
    pSVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,local_458,&local_481);
    SocketLog::post(pSVar2,(string *)local_480);
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    local_494 = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_490,&local_494);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_490);
  } while( true );
}

Assistant:

int main() {
    cout<<"Send string every 1s..."<<endl;

    auto socketLog = SocketLog::getInstance();

    socketLog->setSendInterceptor([](const std::string msg) {
        cout<<"SendInterceptor: "<<msg<<endl;
        return false;
    });

    char buf[1024];
    int count = 0;
    while (true) {
        sprintf(buf, "hello, count=%d\n", count++);
        cout<<"try to send:"<<buf;
        socketLog->post(buf);
        std::this_thread::sleep_for(std::chrono::seconds(1));
    }
    return 0;
}